

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TreePop(void)

{
  int *piVar1;
  ImU32 *pIVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  long lVar6;
  
  pIVar4 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  Unindent(0.0);
  piVar1 = &(pIVar3->DC).TreeDepth;
  *piVar1 = *piVar1 + -1;
  if ((pIVar4->NavMoveDir == 0) && (pIVar4->NavWindow == pIVar3)) {
    bVar5 = NavMoveRequestButNoResultYet();
    if ((bVar5) &&
       ((pIVar4->NavIdIsAlive == true &&
        (((pIVar3->DC).TreeStoreMayJumpToParentOnPop >> ((pIVar3->DC).TreeDepth & 0x1fU) & 1) != 0))
       )) {
      lVar6 = (long)(pIVar3->IDStack).Size;
      if (lVar6 < 1) {
        __assert_fail("Size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui.h"
                      ,0x4e8,"T &ImVector<unsigned int>::back() [T = unsigned int]");
      }
      SetNavID((pIVar3->IDStack).Data[lVar6 + -1],pIVar4->NavLayer);
      NavMoveRequestCancel();
    }
  }
  pIVar2 = &(pIVar3->DC).TreeStoreMayJumpToParentOnPop;
  *pIVar2 = *pIVar2 & ~(-1 << ((byte)(pIVar3->DC).TreeDepth & 0x1f));
  if (1 < (pIVar3->IDStack).Size) {
    PopID();
    return;
  }
  __assert_fail("window->IDStack.Size > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_widgets.cpp"
                ,0x14f2,"void ImGui::TreePop()");
}

Assistant:

void ImGui::TreePop()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    Unindent();

    window->DC.TreeDepth--;
    if (g.NavMoveDir == ImGuiDir_Left && g.NavWindow == window && NavMoveRequestButNoResultYet())
        if (g.NavIdIsAlive && (window->DC.TreeStoreMayJumpToParentOnPop & (1 << window->DC.TreeDepth)))
        {
            SetNavID(window->IDStack.back(), g.NavLayer);
            NavMoveRequestCancel();
        }
    window->DC.TreeStoreMayJumpToParentOnPop &= (1 << window->DC.TreeDepth) - 1;

    IM_ASSERT(window->IDStack.Size > 1); // There should always be 1 element in the IDStack (pushed during window creation). If this triggers you called TreePop/PopID too much.
    PopID();
}